

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFContext.cpp
# Opt level: O1

AppleAcceleratorTable * __thiscall llvm::DWARFContext::getAppleObjC(DWARFContext *this)

{
  DWARFObject *Obj;
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  AppleAcceleratorTable *pAVar3;
  size_t extraout_RDX;
  StringRef StringSection;
  
  Obj = (this->DObj)._M_t.
        super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
        ._M_t.
        super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
        .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl;
  iVar1 = (*Obj->_vptr_DWARFObject[0x28])(Obj);
  iVar2 = (*((this->DObj)._M_t.
             super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
             .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl)->
            _vptr_DWARFObject[0x11])();
  StringSection.Data._4_4_ = extraout_var_00;
  StringSection.Data._0_4_ = iVar2;
  iVar2 = (*((this->DObj)._M_t.
             super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
             .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl)->
            _vptr_DWARFObject[5])();
  StringSection.Length = extraout_RDX;
  pAVar3 = getAccelTable<llvm::AppleAcceleratorTable>
                     (&this->AppleObjC,Obj,(DWARFSection *)CONCAT44(extraout_var,iVar1),
                      StringSection,SUB41(iVar2,0));
  return pAVar3;
}

Assistant:

const AppleAcceleratorTable &DWARFContext::getAppleObjC() {
  return getAccelTable(AppleObjC, *DObj, DObj->getAppleObjCSection(),
                       DObj->getStrSection(), isLittleEndian());
}